

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ShellState::UTF8WidthPrint
          (ShellState *this,FILE *pOut,idx_t w,string *str,bool right_align)

{
  int iVar1;
  char *__s;
  size_t in_RDX;
  FILE *in_RSI;
  byte in_R8B;
  int aw;
  int n;
  int i;
  char *zUtf;
  int *in_stack_ffffffffffffffa8;
  char *pcVar2;
  undefined4 in_stack_ffffffffffffffc0;
  int local_38;
  uint local_34;
  
  __s = (char *)std::__cxx11::string::c_str();
  iVar1 = (int)in_RDX;
  pcVar2 = __s;
  strlen(__s);
  local_34 = linenoiseGetRenderPosition
                       ((char *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_RDX,
                        (int)((ulong)pcVar2 >> 0x20),in_stack_ffffffffffffffa8);
  if ((int)local_34 < 0) {
    local_38 = 0;
    for (local_34 = 0; __s[(int)local_34] != '\0'; local_34 = local_34 + 1) {
      if ((((int)__s[(int)local_34] & 0xc0U) != 0x80) &&
         (local_38 = local_38 + 1, local_38 == iVar1)) goto LAB_001d7fc3;
    }
  }
LAB_001d7ffd:
  if (local_38 < iVar1) {
    if ((in_R8B & 1) == 0) {
      fprintf(in_RSI,"%s%*s",__s,(ulong)(uint)(iVar1 - local_38),anon_var_dwarf_3e84037 + 9);
    }
    else {
      fprintf(in_RSI,"%*s%s",(ulong)(uint)(iVar1 - local_38),anon_var_dwarf_3e84037 + 9,__s);
    }
  }
  else {
    fprintf(in_RSI,"%.*s",(ulong)local_34,__s);
  }
  return;
LAB_001d7fc3:
  do {
    local_34 = local_34 + 1;
  } while (((int)__s[(int)local_34] & 0xc0U) == 0x80);
  goto LAB_001d7ffd;
}

Assistant:

void ShellState::UTF8WidthPrint(FILE *pOut, idx_t w, const string &str, bool right_align) {
	auto zUtf = str.c_str();
	int i;
	int n;
	int aw = w < 0 ? -w : w;
#ifdef HAVE_LINENOISE
	i = linenoiseGetRenderPosition(zUtf, strlen(zUtf), aw, &n);
	if (i < 0)
#endif
		for (i = n = 0; zUtf[i]; i++) {
			if ((zUtf[i] & 0xc0) != 0x80) {
				n++;
				if (n == aw) {
					do {
						i++;
					} while ((zUtf[i] & 0xc0) == 0x80);
					break;
				}
			}
		}
	if (n >= aw) {
		utf8_printf(pOut, "%.*s", i, zUtf);
	} else if (right_align) {
		utf8_printf(pOut, "%*s%s", aw - n, "", zUtf);
	} else {
		utf8_printf(pOut, "%s%*s", zUtf, aw - n, "");
	}
}